

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O3

int tidyDocSaveStream(TidyDocImpl *doc,StreamOut *out)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  TidyAttrSortStrategy strat;
  TidyConfigChangeCallback p_Var12;
  uint uVar13;
  Node *pNVar14;
  
  iVar1 = *(int *)((doc->config).value + 0x4c);
  iVar2 = *(int *)((doc->config).value + 0x1e);
  iVar3 = *(int *)((doc->config).value + 0x3e);
  iVar4 = *(int *)((doc->config).value + 100);
  iVar5 = *(int *)((doc->config).value + 0x62);
  iVar6 = *(int *)((doc->config).value + 4);
  iVar7 = *(int *)((doc->config).value + 6);
  iVar8 = *(int *)((doc->config).value + 0x20);
  iVar9 = *(int *)((doc->config).value + 0x30);
  iVar10 = *(int *)((doc->config).value + 0x2f);
  iVar11 = *(int *)((doc->config).value + 0x19);
  strat = *(TidyAttrSortStrategy *)((doc->config).value + 0x50);
  p_Var12 = doc->pConfigChangeCallback;
  doc->pConfigChangeCallback = (TidyConfigChangeCallback)0x0;
  if (*(int *)((doc->config).value + 0x3f) == 0) {
    prvTidyPPrintSpaces();
  }
  else {
    prvTidyPPrintTabs();
  }
  if (iVar11 != 0) {
    prvTidyConvertCDATANodes(doc,&doc->root);
  }
  if (iVar8 != 0) {
    prvTidyDropComments(doc,&doc->root);
  }
  if (iVar9 != 0) {
    prvTidyDropFontElements(doc,&doc->root,(Node **)0x0);
  }
  if (iVar10 == 0 && (iVar6 == 0 || iVar9 == 0)) {
LAB_00139772:
    prvTidyReplacePreformattedSpaces(doc,&doc->root);
  }
  else {
    prvTidyDowngradeTypography(doc,&doc->root);
    if (iVar10 == 0) goto LAB_00139772;
    prvTidyNormalizeSpaces(doc->lexer,&doc->root);
  }
  prvTidySortAttributes(doc,&doc->root,strat);
  if ((iVar1 == 0) || ((doc->errors != 0 && (iVar2 == 0)))) goto LAB_00139852;
  if ((iVar3 == 1) || (doc->inputHadBOM != no && iVar3 == 2)) {
    prvTidyoutBOM(out);
  }
  doc->docOut = out;
  if ((iVar4 == 0) || (iVar5 != 0)) {
    if (iVar7 == 0) {
LAB_0013982e:
      prvTidyPPrintTree(doc,0,0,&doc->root);
    }
    else {
      if (iVar7 != 1) {
        pNVar14 = prvTidyFindBody(doc);
        if ((pNVar14 == (Node *)0x0) || (pNVar14->implicit == no)) goto LAB_0013982e;
      }
      prvTidyPrintBody(doc);
    }
  }
  else {
    prvTidyPPrintXMLTree(doc,0,0,&doc->root);
  }
  prvTidyPFlushLine(doc,0);
  doc->docOut = (StreamOut *)0x0;
LAB_00139852:
  prvTidyResetConfigToSnapshot(doc);
  doc->pConfigChangeCallback = p_Var12;
  uVar13 = 2;
  if ((doc->errors == 0) && (uVar13 = 1, doc->warnings == 0)) {
    uVar13 = (uint)(doc->accessErrors != 0);
  }
  return uVar13;
}

Assistant:

int         tidyDocSaveStream( TidyDocImpl* doc, StreamOut* out )
{
    Bool showMarkup  = cfgBool( doc, TidyShowMarkup );
    Bool forceOutput = cfgBool( doc, TidyForceOutput );
    Bool outputBOM   = ( cfgAutoBool(doc, TidyOutputBOM) == TidyYesState );
    Bool smartBOM    = ( cfgAutoBool(doc, TidyOutputBOM) == TidyAutoState );
    Bool xmlOut      = cfgBool( doc, TidyXmlOut );
    Bool xhtmlOut    = cfgBool( doc, TidyXhtmlOut );
    TidyTriState bodyOnly    = cfgAutoBool( doc, TidyBodyOnly );

    Bool dropComments = cfgBool(doc, TidyHideComments);
    Bool makeClean    = cfgBool(doc, TidyMakeClean);
    Bool asciiChars   = cfgBool(doc, TidyAsciiChars);
    Bool makeBare     = cfgBool(doc, TidyMakeBare);
    Bool escapeCDATA  = cfgBool(doc, TidyEscapeCdata);
    Bool ppWithTabs   = cfgBool(doc, TidyPPrintTabs);
    TidyAttrSortStrategy sortAttrStrat = cfg(doc, TidySortAttributes);
    TidyConfigChangeCallback callback = doc->pConfigChangeCallback;
    doc->pConfigChangeCallback = NULL;

    if (ppWithTabs)
        TY_(PPrintTabs)();
    else
        TY_(PPrintSpaces)();

    if (escapeCDATA)
        TY_(ConvertCDATANodes)(doc, &doc->root);

    if (dropComments)
        TY_(DropComments)(doc, &doc->root);

    if (makeClean)
    {
        /* noop */
        TY_(DropFontElements)(doc, &doc->root, NULL);
    }

    if ((makeClean && asciiChars) || makeBare)
        TY_(DowngradeTypography)(doc, &doc->root);

    if (makeBare)
        /* Note: no longer replaces &nbsp; in */
        /* attribute values / non-text tokens */
        TY_(NormalizeSpaces)(doc->lexer, &doc->root);
    else
        TY_(ReplacePreformattedSpaces)(doc, &doc->root);

    TY_(SortAttributes)(doc, &doc->root, sortAttrStrat);

    if ( showMarkup && (doc->errors == 0 || forceOutput) )
    {
        /* Output a Byte Order Mark if required */
        if ( outputBOM || (doc->inputHadBOM && smartBOM) )
            TY_(outBOM)( out );

        /* No longer necessary. No DOCTYPE == HTML 3.2,
        ** which gives you only the basic character entities,
        ** which are safe in any browser.
        ** if ( !TY_(FindDocType)(doc) )
        **    TY_(SetOptionBool)( doc, TidyNumEntities, yes );
        */

        doc->docOut = out;
        if ( xmlOut && !xhtmlOut )
            TY_(PPrintXMLTree)( doc, NORMAL, 0, &doc->root );
        else if ( showBodyOnly( doc, bodyOnly ) )
            TY_(PrintBody)( doc );
        else
            TY_(PPrintTree)( doc, NORMAL, 0, &doc->root );

        TY_(PFlushLine)( doc, 0 );
        doc->docOut = NULL;
    }

    TY_(ResetConfigToSnapshot)( doc );
    doc->pConfigChangeCallback = callback;
    
    return tidyDocStatus( doc );
}